

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_api.h
# Opt level: O2

ssize_t __thiscall dummy_api::write(dummy_api *this,int __fd,void *__buf,size_t __n)

{
  undefined8 uVar1;
  bool bVar2;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  unsigned_long uVar3;
  ulong uVar4;
  size_t *psVar5;
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> pVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  const_buffer in;
  
  (**(code **)(*(long *)this + 0x50))
            (&in,this,CONCAT44(in_register_00000034,__fd),(ulong)__buf & 0xffffffff,__n);
  bVar2 = std::operator==(this->output_,"$$$ERROR$$$");
  uVar1 = booster::aio::aio_error_cat;
  if (bVar2) {
    *(undefined4 *)__n = 3;
    *(undefined8 *)(__n + 8) = uVar1;
    uVar4 = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_78,(ulong)this->output_);
    bVar2 = std::operator==(&local_78,"$$$BLOCK$$$");
    uVar4 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
    std::__cxx11::string::~string((string *)&local_78);
    if (((char)uVar4 != '\0') && (*(long *)&this->field_0x60 == *(long *)&this->field_0x68)) {
      local_78._M_dataplus._M_p._0_1_ = 0x78;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>
                ((vector<char,_std::allocator<char>_> *)&this->field_0x60,(char *)&local_78);
    }
    pVar6 = booster::aio::buffer_impl<const_char_*>::get(&in.super_buffer_impl<const_char_*>);
    uVar3 = pVar6.second;
    if (uVar3 != 0) {
      if (this->mark_chunks_ != false) {
        std::__cxx11::string::append((char *)this->output_);
      }
      psVar5 = &(pVar6.first)->size;
      while (bVar2 = uVar3 != 0, uVar3 = uVar3 - 1, bVar2) {
        std::__cxx11::string::append((char *)this->output_,(ulong)((entry *)(psVar5 + -1))->ptr);
        psVar5 = psVar5 + 2;
      }
      if (this->mark_chunks_ != false) {
        std::__cxx11::string::append((char *)this->output_);
      }
    }
    if (((char)((ulong)__buf & 0xffffffff) != '\0') && (this->write_eof_ == true)) {
      std::__cxx11::string::append((char *)this->output_);
    }
    uVar4 = uVar4 ^ 1;
  }
  std::
  _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ::~_Vector_base(&in.super_buffer_impl<const_char_*>.vec_.
                   super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                 );
  return uVar4;
}

Assistant:

virtual bool write(booster::aio::const_buffer const &body_in,bool eof,booster::system::error_code &e) 
	{
		booster::aio::const_buffer in = format_output(body_in,eof,e);
		if(*output_ == "$$$ERROR$$$") {
			e=booster::system::error_code(booster::aio::aio_error::eof,booster::aio::aio_error_cat);
			return false;
		}
		bool block = false;
		if(output_->substr(0,3+5+3) == "$$$BLOCK$$$") {
			if(pending_output_.empty())
				pending_output_.push_back('x');
			block = true;
		}
		std::pair<booster::aio::const_buffer::entry const *,size_t> all=in.get();
		if(all.second!=0) {
			if(mark_chunks_)
				output_->append("[");
			for(size_t i=0;i<all.second;i++)  {
				output_->append(reinterpret_cast<char const *>(all.first[i].ptr),all.first[i].size);
			}
			if(mark_chunks_)
				output_->append("]");
		}
		if(eof && write_eof_)
			output_->append("[EOF]");
		return !block;
	}